

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall antlr::ASTFactory::dupList(ASTFactory *this,RefAST *t)

{
  AST *this_00;
  AST *pAVar1;
  AST *pAVar2;
  ASTRefCount *in_RDX;
  ASTRef *in_RDI;
  RefAST nt;
  RefAST *result;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffff68;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffff70;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  ASTRefCount<antlr::AST> in_stack_ffffffffffffffc0;
  ASTFactory *in_stack_ffffffffffffffc8;
  
  ASTRefCount<antlr::AST>::ASTRefCount(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  dupTree(in_stack_ffffffffffffffc8,(RefAST *)in_stack_ffffffffffffffc0.ref);
  ASTRefCount<antlr::AST>::~ASTRefCount(in_stack_ffffffffffffff70);
  ASTRefCount<antlr::AST>::ASTRefCount(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  while (this_00 = ASTRefCount::operator_cast_to_AST_(in_RDX), this_00 != (AST *)0x0) {
    pAVar1 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDX);
    (*pAVar1->_vptr_AST[0xe])(local_48);
    ASTRefCount<antlr::AST>::operator=
              ((ASTRefCount<antlr::AST> *)in_RDI,(ASTRefCount<antlr::AST> *)in_RDX);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
    pAVar2 = ASTRefCount<antlr::AST>::operator->
                       ((ASTRefCount<antlr::AST> *)&stack0xffffffffffffffc0);
    ASTRefCount<antlr::AST>::ASTRefCount
              ((ASTRefCount<antlr::AST> *)this_00,(ASTRefCount<antlr::AST> *)pAVar1);
    dupTree(in_stack_ffffffffffffffc8,(RefAST *)in_stack_ffffffffffffffc0.ref);
    (*pAVar2->_vptr_AST[0x15])(pAVar2,local_50);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
    pAVar1 = ASTRefCount<antlr::AST>::operator->
                       ((ASTRefCount<antlr::AST> *)&stack0xffffffffffffffc0);
    (*pAVar1->_vptr_AST[0xe])(local_60);
    ASTRefCount<antlr::AST>::operator=
              ((ASTRefCount<antlr::AST> *)in_RDI,(ASTRefCount<antlr::AST> *)in_RDX);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)this_00);
  }
  ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)0x0);
  return (RefAST)in_RDI;
}

Assistant:

RefAST ASTFactory::dupList(RefAST t)
{
	RefAST result = dupTree(t);         // if t == null, then result==null
	RefAST nt = result;

	while( t )
	{												// for each sibling of the root
		t = t->getNextSibling();
		nt->setNextSibling(dupTree(t));	// dup each subtree, building new tree
		nt = nt->getNextSibling();
	}
	return result;
}